

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVT.cpp
# Opt level: O3

void __thiscall OpenMD::NVT::moveB(NVT *this)

{
  undefined8 *puVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  pointer pVVar5;
  pointer pVVar6;
  Snapshot *pSVar7;
  RealType RVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  uint i_4;
  uint uVar11;
  Molecule *pMVar12;
  pointer ppSVar13;
  uint i_3;
  Vector3d *pVVar14;
  uint i_1;
  long lVar15;
  long lVar16;
  StuntDouble *pSVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  pointer ppSVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  pair<double,_double> pVar24;
  Vector<double,_3U> result_3;
  MoleculeIterator i;
  pair<double,_double> thermostat;
  Vector<double,_3U> result_2;
  Vector<double,_3U> result;
  Vector<double,_3U> result_1;
  Vector3d ji;
  Vector3d Tb;
  double local_160;
  Vector3d local_158;
  double local_140;
  double local_138;
  MoleculeIterator local_130;
  pair<double,_double> local_128;
  double local_118 [4];
  double local_f8 [4];
  double local_d8 [3];
  Thermo *local_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  Vector3d local_98;
  double local_78;
  undefined8 uStack_70;
  double local_68 [4];
  double local_48;
  double dStack_40;
  double local_38;
  
  iVar18 = 0;
  local_130._M_node = (_Base_ptr)0x0;
  local_98.super_Vector<double,_3U>.data_[2] = 0.0;
  local_98.super_Vector<double,_3U>.data_[0] = 0.0;
  local_98.super_Vector<double,_3U>.data_[1] = 0.0;
  local_a8 = 0.0;
  local_b8 = 0.0;
  dStack_b0 = 0.0;
  pVar24 = Snapshot::getThermostat((this->super_VelocityVerletIntegrator).super_Integrator.snap);
  local_140 = pVar24.second;
  local_138 = pVar24.first;
  local_128.first = local_138;
  local_128.second = local_140;
  pMVar12 = SimInfo::beginMolecule
                      ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_130);
  if (pMVar12 != (Molecule *)0x0) {
    do {
      ppSVar21 = (pMVar12->integrableObjects_).
                 super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppSVar13 = (pMVar12->integrableObjects_).
                 super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      if ((ppSVar21 != ppSVar13) && (pSVar17 = *ppSVar21, pSVar17 != (StuntDouble *)0x0)) {
        pVVar5 = (this->oldVel_).
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pVVar6 = (this->oldJi_).
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar15 = (long)iVar18 * 0x18;
        do {
          iVar18 = iVar18 + 1;
          ppSVar21 = ppSVar21 + 1;
          pSVar7 = pSVar17->snapshotMan_->currentSnapshot_;
          lVar19 = (long)pSVar17->localIndex_;
          lVar20 = *(long *)((long)&(pSVar7->atomData).velocity.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar17->storage_);
          puVar1 = (undefined8 *)(lVar20 + lVar19 * 0x18);
          uVar9 = *puVar1;
          uVar10 = puVar1[1];
          *(undefined8 *)((long)(pVVar5->super_Vector<double,_3U>).data_ + lVar15 + 0x10) =
               *(undefined8 *)(lVar20 + 0x10 + lVar19 * 0x18);
          puVar1 = (undefined8 *)((long)(pVVar5->super_Vector<double,_3U>).data_ + lVar15);
          *puVar1 = uVar9;
          puVar1[1] = uVar10;
          if (pSVar17->objType_ - otDAtom < 2) {
            lVar20 = *(long *)((long)&(pSVar7->atomData).angularMomentum.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + pSVar17->storage_)
            ;
            puVar1 = (undefined8 *)(lVar20 + lVar19 * 0x18);
            uVar9 = *puVar1;
            uVar10 = puVar1[1];
            *(undefined8 *)((long)(pVVar6->super_Vector<double,_3U>).data_ + lVar15 + 0x10) =
                 *(undefined8 *)(lVar20 + 0x10 + lVar19 * 0x18);
            puVar1 = (undefined8 *)((long)(pVVar6->super_Vector<double,_3U>).data_ + lVar15);
            *puVar1 = uVar9;
            puVar1[1] = uVar10;
          }
          if (ppSVar21 == ppSVar13) break;
          pSVar17 = *ppSVar21;
          lVar15 = lVar15 + 0x18;
        } while (pSVar17 != (StuntDouble *)0x0);
      }
      pMVar12 = SimInfo::nextMolecule
                          ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_130)
      ;
    } while (pMVar12 != (Molecule *)0x0);
  }
  if (this->maxIterNum_ < 1) {
    local_160 = local_138;
  }
  else {
    local_c0 = &(this->super_VelocityVerletIntegrator).super_Integrator.thermo;
    local_140 = 0.0;
    uVar22 = SUB84(local_138,0);
    uVar23 = (undefined4)((ulong)local_138 >> 0x20);
    do {
      local_78 = (double)CONCAT44(uVar23,uVar22);
      uStack_70 = 0;
      RVar8 = Thermo::getTemperature(local_c0);
      local_160 = ((RVar8 / this->targetTemp_ + -1.0) *
                  (this->super_VelocityVerletIntegrator).super_Integrator.dt2) /
                  (this->tauThermostat_ * this->tauThermostat_) + local_138;
      local_128.first = local_160;
      pMVar12 = SimInfo::beginMolecule
                          ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_130)
      ;
      if (pMVar12 != (Molecule *)0x0) {
        lVar15 = 0;
        do {
          ppSVar21 = (pMVar12->integrableObjects_).
                     super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppSVar13 = (pMVar12->integrableObjects_).
                     super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          if ((ppSVar21 != ppSVar13) && (pSVar17 = *ppSVar21, pSVar17 != (StuntDouble *)0x0)) {
            lVar15 = (long)(int)lVar15;
            lVar20 = lVar15 * 0x18;
            do {
              lVar19 = *(long *)((long)&(pSVar17->snapshotMan_->currentSnapshot_->atomData).force.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                pSVar17->storage_);
              local_68[2] = (double)*(undefined8 *)
                                     (lVar19 + 0x10 + (long)pSVar17->localIndex_ * 0x18);
              pdVar2 = (double *)(lVar19 + (long)pSVar17->localIndex_ * 0x18);
              local_68[0] = *pdVar2;
              local_68[1] = pdVar2[1];
              pVVar5 = (this->oldVel_).
                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              dVar3 = (this->super_VelocityVerletIntegrator).super_Integrator.dt2;
              dVar4 = pSVar17->mass_;
              local_f8[0] = 0.0;
              local_f8[1] = 0.0;
              local_f8[2] = 0.0;
              lVar19 = 0;
              do {
                local_f8[lVar19] = local_68[lVar19] * (dVar3 / dVar4) * 0.0004184;
                lVar19 = lVar19 + 1;
              } while (lVar19 != 3);
              local_d8[0] = 0.0;
              local_d8[1] = 0.0;
              local_d8[2] = 0.0;
              lVar19 = 0;
              do {
                local_d8[lVar19] =
                     *(double *)
                      ((long)(pVVar5->super_Vector<double,_3U>).data_ + lVar19 * 8 + lVar20) +
                     local_f8[lVar19];
                lVar19 = lVar19 + 1;
              } while (lVar19 != 3);
              local_118[0] = 0.0;
              local_118[1] = 0.0;
              local_118[2] = 0.0;
              lVar19 = 0;
              do {
                local_118[lVar19] =
                     *(double *)
                      ((long)(pVVar5->super_Vector<double,_3U>).data_ + lVar19 * 8 + lVar20) *
                     dVar3 * local_160;
                lVar19 = lVar19 + 1;
              } while (lVar19 != 3);
              local_158.super_Vector<double,_3U>.data_[0] = 0.0;
              local_158.super_Vector<double,_3U>.data_[1] = 0.0;
              local_158.super_Vector<double,_3U>.data_[2] = 0.0;
              lVar19 = 0;
              do {
                local_158.super_Vector<double,_3U>.data_[lVar19] =
                     local_d8[lVar19] - local_118[lVar19];
                lVar19 = lVar19 + 1;
              } while (lVar19 != 3);
              local_38 = local_158.super_Vector<double,_3U>.data_[2];
              local_48 = local_158.super_Vector<double,_3U>.data_[0];
              dStack_40 = local_158.super_Vector<double,_3U>.data_[1];
              pSVar7 = pSVar17->snapshotMan_->currentSnapshot_;
              lVar16 = (long)pSVar17->localIndex_;
              lVar19 = *(long *)((long)&(pSVar7->atomData).velocity.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                pSVar17->storage_);
              *(double *)(lVar19 + 0x10 + lVar16 * 0x18) =
                   local_158.super_Vector<double,_3U>.data_[2];
              pdVar2 = (double *)(lVar19 + lVar16 * 0x18);
              *pdVar2 = local_158.super_Vector<double,_3U>.data_[0];
              pdVar2[1] = local_158.super_Vector<double,_3U>.data_[1];
              if (pSVar17->objType_ - otDAtom < 2) {
                pVVar14 = (Vector3d *)
                          (lVar16 * 0x18 +
                          *(long *)((long)&(pSVar7->atomData).torque.
                                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start +
                                   pSVar17->storage_));
                local_158.super_Vector<double,_3U>.data_[0] = 0.0;
                local_158.super_Vector<double,_3U>.data_[1] = 0.0;
                local_158.super_Vector<double,_3U>.data_[2] = 0.0;
                if (pVVar14 != &local_158) {
                  lVar19 = 0;
                  do {
                    local_158.super_Vector<double,_3U>.data_[lVar19] =
                         (pVVar14->super_Vector<double,_3U>).data_[lVar19];
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != 3);
                }
                StuntDouble::lab2Body(&local_98,pSVar17,&local_158);
                pVVar5 = (this->oldJi_).
                         super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                dVar3 = (this->super_VelocityVerletIntegrator).super_Integrator.dt2;
                local_f8[0] = 0.0;
                local_f8[1] = 0.0;
                local_f8[2] = 0.0;
                lVar19 = 0;
                do {
                  local_f8[lVar19] =
                       local_98.super_Vector<double,_3U>.data_[lVar19] * dVar3 * 0.0004184;
                  lVar19 = lVar19 + 1;
                } while (lVar19 != 3);
                local_d8[0] = 0.0;
                local_d8[1] = 0.0;
                local_d8[2] = 0.0;
                lVar19 = 0;
                do {
                  local_d8[lVar19] =
                       *(double *)
                        ((long)(pVVar5->super_Vector<double,_3U>).data_ + lVar19 * 8 + lVar20) +
                       local_f8[lVar19];
                  lVar19 = lVar19 + 1;
                } while (lVar19 != 3);
                local_118[0] = 0.0;
                local_118[1] = 0.0;
                local_118[2] = 0.0;
                lVar19 = 0;
                do {
                  local_118[lVar19] =
                       *(double *)
                        ((long)(pVVar5->super_Vector<double,_3U>).data_ + lVar19 * 8 + lVar20) *
                       dVar3 * local_128.first;
                  lVar19 = lVar19 + 1;
                } while (lVar19 != 3);
                local_158.super_Vector<double,_3U>.data_[0] = 0.0;
                local_158.super_Vector<double,_3U>.data_[1] = 0.0;
                local_158.super_Vector<double,_3U>.data_[2] = 0.0;
                lVar19 = 0;
                do {
                  local_158.super_Vector<double,_3U>.data_[lVar19] =
                       local_d8[lVar19] - local_118[lVar19];
                  lVar19 = lVar19 + 1;
                } while (lVar19 != 3);
                local_a8 = local_158.super_Vector<double,_3U>.data_[2];
                local_b8 = local_158.super_Vector<double,_3U>.data_[0];
                dStack_b0 = local_158.super_Vector<double,_3U>.data_[1];
                iVar18 = pSVar17->localIndex_;
                lVar19 = *(long *)((long)&(pSVar17->snapshotMan_->currentSnapshot_->atomData).
                                          angularMomentum.
                                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                  pSVar17->storage_);
                *(double *)(lVar19 + 0x10 + (long)iVar18 * 0x18) =
                     local_158.super_Vector<double,_3U>.data_[2];
                pdVar2 = (double *)(lVar19 + (long)iVar18 * 0x18);
                *pdVar2 = local_158.super_Vector<double,_3U>.data_[0];
                pdVar2[1] = local_158.super_Vector<double,_3U>.data_[1];
                ppSVar13 = (pMVar12->integrableObjects_).
                           super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                local_160 = local_128.first;
              }
              lVar15 = lVar15 + 1;
              ppSVar21 = ppSVar21 + 1;
              if (ppSVar21 == ppSVar13) break;
              pSVar17 = *ppSVar21;
              lVar20 = lVar20 + 0x18;
            } while (pSVar17 != (StuntDouble *)0x0);
          }
          pMVar12 = SimInfo::nextMolecule
                              ((this->super_VelocityVerletIntegrator).super_Integrator.info_,
                               &local_130);
        } while (pMVar12 != (Molecule *)0x0);
      }
      Rattle::constraintB((this->super_VelocityVerletIntegrator).super_Integrator.rattle_);
      if (ABS(local_78 - local_160) <= this->chiTolerance_) break;
      uVar11 = SUB84(local_140,0) + 1;
      local_140 = (double)(ulong)uVar11;
      uVar22 = SUB84(local_160,0);
      uVar23 = (undefined4)((ulong)local_160 >> 0x20);
    } while ((int)uVar11 < this->maxIterNum_);
    local_140 = local_128.second;
  }
  (*((this->super_VelocityVerletIntegrator).super_Integrator.flucQ_)->
    _vptr_FluctuatingChargePropagator[6])();
  local_128.second =
       local_160 * (this->super_VelocityVerletIntegrator).super_Integrator.dt2 + local_140;
  Snapshot::setThermostat((this->super_VelocityVerletIntegrator).super_Integrator.snap,&local_128);
  return;
}

Assistant:

void NVT::moveB() {
    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule* mol;
    StuntDouble* sd;

    Vector3d Tb;
    Vector3d ji;
    Vector3d vel;
    Vector3d frc;
    RealType mass;
    RealType instTemp;
    int index;
    // Set things up for the iteration:

    pair<RealType, RealType> thermostat = snap->getThermostat();
    RealType oldChi                     = thermostat.first;
    RealType prevChi;

    index = 0;
    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        oldVel_[index] = sd->getVel();

        if (sd->isDirectional()) oldJi_[index] = sd->getJ();

        ++index;
      }
    }

    // do the iteration:

    for (int k = 0; k < maxIterNum_; k++) {
      index    = 0;
      instTemp = thermo.getTemperature();

      // evolve chi another half step using the temperature at t + dt/2

      prevChi          = thermostat.first;
      thermostat.first = oldChi + dt2 * (instTemp / targetTemp_ - 1.0) /
                                      (tauThermostat_ * tauThermostat_);

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (sd = mol->beginIntegrableObject(j); sd != NULL;
             sd = mol->nextIntegrableObject(j)) {
          frc  = sd->getFrc();
          mass = sd->getMass();

          // velocity half step

          vel = oldVel_[index] + dt2 / mass * Constants::energyConvert * frc -
                dt2 * thermostat.first * oldVel_[index];

          sd->setVel(vel);

          if (sd->isDirectional()) {
            // get and convert the torque to body frame

            Tb = sd->lab2Body(sd->getTrq());

            ji = oldJi_[index] + dt2 * Constants::energyConvert * Tb -
                 dt2 * thermostat.first * oldJi_[index];

            sd->setJ(ji);
          }

          ++index;
        }
      }

      rattle_->constraintB();

      if (fabs(prevChi - thermostat.first) <= chiTolerance_) break;
    }

    flucQ_->moveB();

    thermostat.second += dt2 * thermostat.first;
    snap->setThermostat(thermostat);
  }